

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedSlowWithCopy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value,Arena *value_arena,Arena *my_arena)

{
  Type *pTVar1;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  
  pTVar1 = value;
  if (value_arena == (Arena *)0x0 && my_arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::Message>(my_arena,value);
  }
  else if (my_arena != value_arena) {
    pTVar1 = GenericTypeHandler<google::protobuf::Message>::NewFromPrototype(value,my_arena);
    GenericTypeHandler<google::protobuf::Message>::Merge
              ((GenericTypeHandler<google::protobuf::Message> *)value,pTVar1,
               (Message *)CONCAT71(extraout_var,extraout_DL));
    if (value_arena == (Arena *)0x0) {
      (*(value->super_MessageLite)._vptr_MessageLite[1])(value);
    }
  }
  UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
            (this,pTVar1);
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedSlowWithCopy(
    // Pass value_arena and my_arena to avoid duplicate virtual call (value) or
    // load (mine).
    typename TypeHandler::Type* value, Arena* value_arena, Arena* my_arena) {
  // Ensure that either the value is in the same arena, or if not, we do the
  // appropriate thing: Own() it (if it's on heap and we're in an arena) or copy
  // it to our arena/heap (otherwise).
  if (my_arena != NULL && value_arena == NULL) {
    my_arena->Own(value);
  } else if (my_arena != value_arena) {
    typename TypeHandler::Type* new_value =
        TypeHandler::NewFromPrototype(value, my_arena);
    TypeHandler::Merge(*value, new_value);
    TypeHandler::Delete(value, value_arena);
    value = new_value;
  }

  UnsafeArenaAddAllocated<TypeHandler>(value);
}